

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_rs_generator.cc
# Opt level: O1

void __thiscall
t_rs_generator::render_enum_impl(t_rs_generator *this,t_enum *tenum,string *enum_name)

{
  int *piVar1;
  t_enum_value *ptVar2;
  ostream *poVar3;
  pointer pptVar4;
  ofstream_with_content_based_conditional_update *poVar5;
  vector<t_enum_value_*,_std::allocator<t_enum_value_*>_> constants;
  string local_90;
  ofstream_with_content_based_conditional_update *local_70;
  string local_68;
  vector<t_enum_value_*,_std::allocator<t_enum_value_*>_> local_48;
  
  poVar5 = &this->f_gen_;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5,"impl ",5);
  local_70 = poVar5;
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)poVar5,(enum_name->_M_dataplus)._M_p,enum_name->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," {",2);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  piVar1 = &(this->super_t_generator).indent_;
  *piVar1 = *piVar1 + 1;
  std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>::vector(&local_48,&tenum->constants_)
  ;
  pptVar4 = local_48.super__Vector_base<t_enum_value_*,_std::allocator<t_enum_value_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (local_48.super__Vector_base<t_enum_value_*,_std::allocator<t_enum_value_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_48.super__Vector_base<t_enum_value_*,_std::allocator<t_enum_value_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      ptVar2 = *pptVar4;
      render_rustdoc(this,&ptVar2->super_t_doc);
      t_generator::indent_abi_cxx11_(&local_90,&this->super_t_generator);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_70,local_90._M_dataplus._M_p,local_90._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"pub const ",10);
      rust_enum_variant_name(&local_68,this,&ptVar2->name_);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,local_68._M_dataplus._M_p,local_68._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,": ",2);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,(enum_name->_M_dataplus)._M_p,enum_name->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," = ",3);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,(enum_name->_M_dataplus)._M_p,enum_name->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"(",1);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,ptVar2->value_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,";",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p);
      }
      pptVar4 = pptVar4 + 1;
    } while (pptVar4 !=
             local_48.super__Vector_base<t_enum_value_*,_std::allocator<t_enum_value_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  t_generator::indent_abi_cxx11_(&local_90,&this->super_t_generator);
  poVar5 = local_70;
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_70,local_90._M_dataplus._M_p,local_90._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,"pub const ENUM_VALUES: &\'static [Self] = &[",0x2b);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  piVar1 = &(this->super_t_generator).indent_;
  *piVar1 = *piVar1 + 1;
  pptVar4 = local_48.super__Vector_base<t_enum_value_*,_std::allocator<t_enum_value_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (local_48.super__Vector_base<t_enum_value_*,_std::allocator<t_enum_value_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_48.super__Vector_base<t_enum_value_*,_std::allocator<t_enum_value_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      ptVar2 = *pptVar4;
      t_generator::indent_abi_cxx11_(&local_90,&this->super_t_generator);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)poVar5,local_90._M_dataplus._M_p,local_90._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Self::",6);
      rust_enum_variant_name(&local_68,this,&ptVar2->name_);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,local_68._M_dataplus._M_p,local_68._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,",",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      poVar5 = local_70;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p);
      }
      pptVar4 = pptVar4 + 1;
    } while (pptVar4 !=
             local_48.super__Vector_base<t_enum_value_*,_std::allocator<t_enum_value_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  piVar1 = &(this->super_t_generator).indent_;
  *piVar1 = *piVar1 + -1;
  t_generator::indent_abi_cxx11_(&local_90,&this->super_t_generator);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)poVar5,local_90._M_dataplus._M_p,local_90._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"];",2);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  t_generator::indent_abi_cxx11_(&local_90,&this->super_t_generator);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)poVar5,local_90._M_dataplus._M_p,local_90._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,"#[allow(clippy::trivially_copy_pass_by_ref)]",0x2c);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  t_generator::indent_abi_cxx11_(&local_90,&this->super_t_generator);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)poVar5,local_90._M_dataplus._M_p,local_90._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,
             "pub fn write_to_out_protocol(&self, o_prot: &mut dyn TOutputProtocol) -> thrift::Result<()> {"
             ,0x5d);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  piVar1 = &(this->super_t_generator).indent_;
  *piVar1 = *piVar1 + 1;
  t_generator::indent_abi_cxx11_(&local_90,&this->super_t_generator);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)poVar5,local_90._M_dataplus._M_p,local_90._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"o_prot.write_i32(self.0)",0x18);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  piVar1 = &(this->super_t_generator).indent_;
  *piVar1 = *piVar1 + -1;
  t_generator::indent_abi_cxx11_(&local_90,&this->super_t_generator);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)poVar5,local_90._M_dataplus._M_p,local_90._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"}",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  t_generator::indent_abi_cxx11_(&local_90,&this->super_t_generator);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)poVar5,local_90._M_dataplus._M_p,local_90._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,
             "pub fn read_from_in_protocol(i_prot: &mut dyn TInputProtocol) -> thrift::Result<",0x50
            );
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,(enum_name->_M_dataplus)._M_p,enum_name->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"> {",3);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  piVar1 = &(this->super_t_generator).indent_;
  *piVar1 = *piVar1 + 1;
  t_generator::indent_abi_cxx11_(&local_90,&this->super_t_generator);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)poVar5,local_90._M_dataplus._M_p,local_90._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,"let enum_value = i_prot.read_i32()?;",0x24);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  t_generator::indent_abi_cxx11_(&local_90,&this->super_t_generator);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)poVar5,local_90._M_dataplus._M_p,local_90._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Ok(",3);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,(enum_name->_M_dataplus)._M_p,enum_name->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"::from(enum_value)",0x12);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  piVar1 = &(this->super_t_generator).indent_;
  *piVar1 = *piVar1 + -1;
  t_generator::indent_abi_cxx11_(&local_90,&this->super_t_generator);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)poVar5,local_90._M_dataplus._M_p,local_90._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"}",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  piVar1 = &(this->super_t_generator).indent_;
  *piVar1 = *piVar1 + -1;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5,"}",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
            );
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
            );
  if (local_48.super__Vector_base<t_enum_value_*,_std::allocator<t_enum_value_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<t_enum_value_*,_std::allocator<t_enum_value_*>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void t_rs_generator::render_enum_impl(t_enum* tenum, const string& enum_name) {
  f_gen_ << "impl " << enum_name << " {" << endl;
  indent_up();

  vector<t_enum_value*> constants = tenum->get_constants();

  // associated constants for each IDL-defined enum variant
  {
      vector<t_enum_value*>::iterator constants_iter;
      for (constants_iter = constants.begin(); constants_iter != constants.end(); ++constants_iter) {
        t_enum_value* val = (*constants_iter);
        render_rustdoc((t_doc*) val);
        f_gen_
            << indent()
            << "pub const " << rust_enum_variant_name(val->get_name()) << ": " << enum_name
            << " = "
            << enum_name << "(" << val->get_value() << ")"
            << ";"
            << endl;
      }
  }

  // array containing all IDL-defined enum variants
  {
    f_gen_ << indent() << "pub const ENUM_VALUES: &'static [Self] = &[" << endl;
    indent_up();
    vector<t_enum_value*>::iterator constants_iter;
    for (constants_iter = constants.begin(); constants_iter != constants.end(); ++constants_iter) {
      t_enum_value* val = (*constants_iter);
      f_gen_
          << indent()
          << "Self::" << rust_enum_variant_name(val->get_name())
          << ","
          << endl;
    }
    indent_down();
    f_gen_ << indent() << "];" << endl;
  }

  f_gen_ << indent() << "#[allow(clippy::trivially_copy_pass_by_ref)]" << endl;
  f_gen_
    << indent()
    << "pub fn write_to_out_protocol(&self, o_prot: &mut dyn TOutputProtocol) -> thrift::Result<()> {"
    << endl;
  indent_up();
  f_gen_ << indent() << "o_prot.write_i32(self.0)" << endl;
  indent_down();
  f_gen_ << indent() << "}" << endl;

  f_gen_
    << indent()
    << "pub fn read_from_in_protocol(i_prot: &mut dyn TInputProtocol) -> thrift::Result<" << enum_name << "> {"
    << endl;
  indent_up();
  f_gen_ << indent() << "let enum_value = i_prot.read_i32()?;" << endl;
  f_gen_ << indent() << "Ok(" << enum_name << "::from(enum_value)" << ")" << endl;
  indent_down();
  f_gen_ << indent() << "}" << endl;

  indent_down();
  f_gen_ << "}" << endl;
  f_gen_ << endl;
}